

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnode_traverse.c
# Opt level: O2

mpt_node * mpt_gnode_traverse(mpt_node *node,int flags,mpt_node_handler_t traverse,void *data)

{
  int *piVar1;
  mpt_node *pmVar2;
  code *pcVar3;
  
  if (node == (mpt_node *)0x0 || traverse == (mpt_node_handler_t)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0xe;
  }
  else {
    switch((uint)flags >> 2 & 3) {
    case 0:
      pcVar3 = _mpt_gnode_traverse_post;
      break;
    case 1:
      pcVar3 = _mpt_gnode_traverse_pre;
      break;
    case 2:
      pcVar3 = _mpt_gnode_traverse_in;
      break;
    case 3:
      pmVar2 = _mpt_gnode_traverse_level(node,flags,0,traverse,data);
      return pmVar2;
    }
    do {
      pmVar2 = (mpt_node *)(*pcVar3)(node,flags,0,traverse,data);
      if (pmVar2 != (mpt_node *)0x0) {
        return pmVar2;
      }
      node = node->next;
    } while (node != (mpt_node *)0x0);
  }
  return (mpt_node *)0x0;
}

Assistant:

extern MPT_STRUCT(node) *mpt_gnode_traverse(MPT_STRUCT(node) *node, int flags, MPT_TYPE(node_handler) traverse, void *data)
{
	MPT_STRUCT(node) *(*process)(MPT_STRUCT(node) *, int, size_t, MPT_TYPE(node_handler), void *);
	
	if (!node || !traverse) {
		errno = EFAULT;
		return 0;
	}
	
	switch (flags & MPT_ENUM(TraverseOrders)) {
		case MPT_ENUM(TraverseInOrder):
			process = _mpt_gnode_traverse_in; break;
		case MPT_ENUM(TraversePreOrder):
			process = _mpt_gnode_traverse_pre; break;
		case MPT_ENUM(TraversePostOrder):
			process = _mpt_gnode_traverse_post; break;
		case MPT_ENUM(TraverseLevelOrder):
			return _mpt_gnode_traverse_level(node, flags, 0, traverse, data);
		default:
			errno = EINVAL;
			return 0;
	}
	do {
		MPT_STRUCT(node) *ret = process(node, flags, 0, traverse, data);
		if (ret) {
			return ret;
		}
	} while ((node = node->next));
	
	return 0;
}